

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::xtToName(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint index;
  Definition *pDVar1;
  Definition *pDVar2;
  size_t sVar3;
  
  requireDStackDepth(this,1,"XT>NAME");
  requireDStackAvailable(this,1,"XT>NAME");
  this_00 = &this->dStack;
  index = ForthStack<unsigned_int>::getTop(this_00);
  pDVar1 = definitionsAt(this,index);
  pDVar2 = definitionsAt(this,index);
  sVar3 = PutStringToEndOfDataSpace(this,&pDVar2->name);
  ForthStack<unsigned_int>::setTop(this_00,(uint)sVar3);
  ForthStack<unsigned_int>::push(this_00,(uint)(pDVar1->name)._M_string_length);
  return;
}

Assistant:

void xtToName() {
			REQUIRE_DSTACK_DEPTH(1, "XT>NAME");
			REQUIRE_DSTACK_AVAILABLE(1, "XT>NAME");
			auto xt = XT(dStack.getTop());
			auto& name = definitionsAt(xt).name;
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(definitionsAt(xt).name);
			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(name.length()));
		}